

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6c02f::ir_algebraic_visitor::handle_rvalue
          (ir_algebraic_visitor *this,ir_rvalue **rvalue)

{
  ir_expression *ir;
  ir_rvalue *piVar1;
  ir_rvalue *new_rvalue;
  ir_expression *expr;
  ir_rvalue **rvalue_local;
  ir_algebraic_visitor *this_local;
  
  if ((((*rvalue != (ir_rvalue *)0x0) &&
       (ir = ir_instruction::as_expression(&(*rvalue)->super_ir_instruction),
       ir != (ir_expression *)0x0)) && (ir->operation != ir_last_opcode)) &&
     (piVar1 = handle_expression(this,ir), piVar1 != *rvalue)) {
    piVar1 = swizzle_if_required(this,ir,piVar1);
    *rvalue = piVar1;
    this->progress = true;
  }
  return;
}

Assistant:

void
ir_algebraic_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_expression *expr = (*rvalue)->as_expression();
   if (!expr || expr->operation == ir_quadop_vector)
      return;

   ir_rvalue *new_rvalue = handle_expression(expr);
   if (new_rvalue == *rvalue)
      return;

   /* If the expr used to be some vec OP scalar returning a vector, and the
    * optimization gave us back a scalar, we still need to turn it into a
    * vector.
    */
   *rvalue = swizzle_if_required(expr, new_rvalue);

   this->progress = true;
}